

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools_inl.hpp
# Opt level: O0

string * CLI::detail::add_escaped_characters(string *__return_storage_ptr__,string *str)

{
  bool bVar1;
  reference pcVar2;
  long lVar3;
  char cVar4;
  size_type sloc;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_48;
  char s;
  const_iterator __end2;
  const_iterator __begin2;
  string *__range2;
  string *str_local;
  string *out;
  
  ::std::__cxx11::string::string((string *)__return_storage_ptr__);
  ::std::__cxx11::string::size();
  ::std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  __end2._M_current = (char *)::std::__cxx11::string::begin();
  _Stack_48._M_current = (char *)::std::__cxx11::string::end();
  while (bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xffffffffffffffb8), bVar1) {
    pcVar2 = __gnu_cxx::
             __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end2);
    lVar3 = ::std::__cxx11::string::find_first_of('\x18',(ulong)(uint)(int)*pcVar2);
    cVar4 = (char)__return_storage_ptr__;
    if (lVar3 == -1) {
      ::std::__cxx11::string::push_back(cVar4);
    }
    else {
      ::std::__cxx11::string::push_back(cVar4);
      ::std::__cxx11::string::operator[](0x33ad38);
      ::std::__cxx11::string::push_back(cVar4);
    }
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end2);
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string add_escaped_characters(const std::string &str) {
    std::string out;
    out.reserve(str.size() + 4);
    for(char s : str) {
        auto sloc = escapedChars.find_first_of(s);
        if(sloc != std::string::npos) {
            out.push_back('\\');
            out.push_back(escapedCharsCode[sloc]);
        } else {
            out.push_back(s);
        }
    }
    return out;
}